

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u16 uVar2;
  byte bVar3;
  bool bVar4;
  u32 uVar5;
  ulong in_RAX;
  ulong uVar6;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  uVar1 = (this->queue).irc;
  local_28 = in_RAX;
  readExt(this);
  uVar2 = (this->queue).irc;
  readExt(this);
  bVar4 = readOp<(moira::Mode)3,(moira::Size)4,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  if (bVar4) {
    uVar6 = (ulong)CONCAT22(uVar1,uVar2) + (local_28 & 0xffffffff);
    bVar4 = SUB81(uVar6 >> 0x20,0);
    (this->reg).sr.c = bVar4;
    (this->reg).sr.x = bVar4;
    bVar3 = (byte)(uVar6 >> 0x18);
    (this->reg).sr.v =
         (bool)((byte)(((byte)(local_28 >> 0x18) ^ bVar3) & ((byte)(uVar1 >> 8) ^ bVar3)) >> 7);
    (this->reg).sr.z = (uint)uVar6 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar6 >> 0x1f) & 1);
    uVar5 = (this->reg).pc;
    (this->reg).pc0 = uVar5;
    (this->queue).ird = (this->queue).irc;
    uVar5 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar5 + 2);
    (this->queue).irc = (u16)uVar5;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>
              (this,local_28._4_4_,(uint)(uVar6 >> 0x10) & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_28._4_4_ + 2,(uint)uVar6 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}